

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

void __thiscall
unodb::detail::deallocation_request::deallocation_request
          (deallocation_request *this,void *pointer_,qsbr_epoch request_epoch_,
          debug_callback *dealloc_callback_)

{
  debug_callback *dealloc_callback__local;
  void *pointer__local;
  deallocation_request *this_local;
  qsbr_epoch request_epoch__local;
  
  this->pointer = pointer_;
  std::function<void_(const_void_*)>::function(&this->dealloc_callback,dealloc_callback_);
  (this->request_epoch).epoch_val = request_epoch_.epoch_val;
  LOCK();
  instance_count = instance_count + 1;
  UNLOCK();
  return;
}

Assistant:

explicit deallocation_request(void *pointer_ UNODB_DETAIL_LIFETIMEBOUND
#ifndef NDEBUG
                                ,
                                qsbr_epoch request_epoch_,
                                debug_callback dealloc_callback_
#endif
                                ) noexcept
      : pointer{pointer_}
#ifndef NDEBUG
        ,
        dealloc_callback{std::move(dealloc_callback_)},
        request_epoch{request_epoch_}
#endif
  {
#ifndef NDEBUG
    instance_count.fetch_add(1, std::memory_order_relaxed);
#endif
  }